

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O1

int __thiscall prmon::monitored_value::set_value(monitored_value *this,mon_value new_value)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  mon_value mVar8;
  long *plVar9;
  char cVar10;
  char cVar11;
  ulong uVar12;
  string s_new_value;
  string s_offset;
  char *local_148;
  uint local_140;
  char local_138 [16];
  long *local_128;
  long local_120;
  long local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  char *local_a8;
  uint local_a0;
  char local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = this->m_offset;
  uVar12 = new_value - uVar7;
  if (new_value < uVar7) {
    cVar10 = '\x01';
    cVar11 = '\x01';
    if (9 < uVar7) {
      uVar12 = uVar7;
      cVar3 = '\x04';
      do {
        cVar11 = cVar3;
        if (uVar12 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00177bf5;
        }
        if (uVar12 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00177bf5;
        }
        if (uVar12 < 10000) goto LAB_00177bf5;
        bVar2 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar3 = cVar11 + '\x04';
      } while (bVar2);
      cVar11 = cVar11 + '\x01';
    }
LAB_00177bf5:
    local_a8 = local_98;
    std::__cxx11::string::_M_construct((ulong)&local_a8,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_a8,local_a0,uVar7);
    if (9 < new_value) {
      mVar8 = new_value;
      cVar11 = '\x04';
      do {
        cVar10 = cVar11;
        if (mVar8 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00177c79;
        }
        if (mVar8 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00177c79;
        }
        if (mVar8 < 10000) goto LAB_00177c79;
        bVar2 = 99999 < mVar8;
        mVar8 = mVar8 / 10000;
        cVar11 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_00177c79:
    local_148 = local_138;
    std::__cxx11::string::_M_construct((ulong)&local_148,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_148,local_140,new_value);
    pcVar1 = (this->m_param).m_name._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->m_param).m_name._M_string_length);
    std::operator+(&local_50,"Error: attempt to set value of ",&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_f8 = *plVar9;
      lStack_f0 = plVar5[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *plVar9;
      local_108 = (long *)*plVar5;
    }
    local_100 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_d8 = *plVar9;
      lStack_d0 = plVar5[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar9;
      local_e8 = (long *)*plVar5;
    }
    local_e0 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_b8 = *plVar9;
      lStack_b0 = plVar5[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar9;
      local_c8 = (long *)*plVar5;
    }
    local_c0 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
    plVar9 = plVar5 + 2;
    if ((long *)*plVar5 == plVar9) {
      local_118 = *plVar9;
      uStack_110 = (undefined4)plVar5[3];
      uStack_10c = *(undefined4 *)((long)plVar5 + 0x1c);
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar9;
      local_128 = (long *)*plVar5;
    }
    local_120 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((spdlog::details::registry::instance()::s_instance == '\0') &&
       (iVar4 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance), iVar4 != 0)
       ) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0);
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00177f27:
      operator_delete(local_70._M_dataplus._M_p);
    }
LAB_00177f2c:
    if (local_148 != local_138) {
      operator_delete(local_148);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
    iVar4 = 1;
  }
  else {
    if (this->m_monotonic == true) {
      if (uVar12 < this->m_value) {
        cVar10 = '\x01';
        cVar11 = '\x01';
        if (9 < uVar12) {
          uVar7 = uVar12;
          cVar3 = '\x04';
          do {
            cVar11 = cVar3;
            if (uVar7 < 100) {
              cVar11 = cVar11 + -2;
              goto LAB_00177f6b;
            }
            if (uVar7 < 1000) {
              cVar11 = cVar11 + -1;
              goto LAB_00177f6b;
            }
            if (uVar7 < 10000) goto LAB_00177f6b;
            bVar2 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar3 = cVar11 + '\x04';
          } while (bVar2);
          cVar11 = cVar11 + '\x01';
        }
LAB_00177f6b:
        local_a8 = local_98;
        std::__cxx11::string::_M_construct((ulong)&local_a8,cVar11);
        std::__detail::__to_chars_10_impl<unsigned_long_long>(local_a8,local_a0,uVar12);
        uVar7 = this->m_value;
        if (9 < uVar7) {
          uVar12 = uVar7;
          cVar11 = '\x04';
          do {
            cVar10 = cVar11;
            if (uVar12 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00177fea;
            }
            if (uVar12 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00177fea;
            }
            if (uVar12 < 10000) goto LAB_00177fea;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar11 = cVar10 + '\x04';
          } while (bVar2);
          cVar10 = cVar10 + '\x01';
        }
LAB_00177fea:
        local_148 = local_138;
        std::__cxx11::string::_M_construct((ulong)&local_148,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long_long>(local_148,local_140,uVar7);
        pcVar1 = (this->m_param).m_name._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + (this->m_param).m_name._M_string_length);
        std::operator+(&local_50,"Error: attempt to reduce the monitored value of monotonic ",
                       &local_70);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_f8 = *plVar5;
          lStack_f0 = puVar6[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar5;
          local_108 = (long *)*puVar6;
        }
        local_100 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_148);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_d8 = *plVar5;
          lStack_d0 = puVar6[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar5;
          local_e8 = (long *)*puVar6;
        }
        local_e0 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_b8 = *plVar5;
          lStack_b0 = puVar6[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar5;
          local_c8 = (long *)*puVar6;
        }
        local_c0 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8);
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_118 = *plVar5;
          uStack_110 = *(undefined4 *)(puVar6 + 3);
          uStack_10c = *(undefined4 *)((long)puVar6 + 0x1c);
          local_128 = &local_118;
        }
        else {
          local_118 = *plVar5;
          local_128 = (long *)*puVar6;
        }
        local_120 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if ((spdlog::details::registry::instance()::s_instance == '\0') &&
           (iVar4 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance),
           iVar4 != 0)) {
          spdlog::details::registry::registry
                    ((registry *)spdlog::details::registry::instance()::s_instance);
          __cxa_atexit(spdlog::details::registry::~registry,
                       spdlog::details::registry::instance()::s_instance,&__dso_handle);
          __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
        }
        local_88 = 0;
        uStack_80 = 0;
        local_78 = 0;
        spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0)
        ;
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00177f27;
        goto LAB_00177f2c;
      }
      this->m_value = uVar12;
      this->m_max_value = uVar12;
    }
    else {
      this->m_value = uVar12;
      if (this->m_max_value < uVar12) {
        this->m_max_value = uVar12;
      }
      this->m_summed_value = this->m_summed_value + uVar12;
      this->m_iterations = this->m_iterations + 1;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int monitored_value::set_value(mon_value new_value) {
  // If we have an offset for this parameter then passing in
  // a set value less than this is illegal
  if (new_value < m_offset) {
    std::string s_offset = std::to_string(m_offset);
    std::string s_new_value = std::to_string(new_value);
    spdlog::error("Error: attempt to set value of " + m_param.get_name() +
                  " to " + s_new_value +
                  ", less than this parameter's offset of " + s_offset);
    return 1;
  }
  new_value -= m_offset;

  if (m_monotonic) {
    // Monotonic values only increase and never have useful
    // sums or average values based on iterations
    if (new_value < m_value) {
      std::string s_new_value = std::to_string(new_value);
      std::string s_value = std::to_string(m_value);
      spdlog::error(
          "Error: attempt to reduce the monitored value of monotonic " +
          m_param.get_name() + " from " + s_value + " to " + s_new_value);
      return 1;
    }
    m_value = new_value;
    m_max_value = new_value;
  } else {
    // Non-monotonic values can go up and down and have
    // useful average values
    m_value = new_value;
    if (m_value > m_max_value) m_max_value = m_value;
    m_summed_value += m_value;
    ++m_iterations;
  }
  return 0;
}